

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O1

void free_kd_tree(kd_tree_node_t *tree)

{
  if (tree != (kd_tree_node_t *)0x0) {
    free_kd_tree(tree->left);
    free_kd_tree(tree->right);
    if (tree->n_level != 0) {
      ckd_free_2d(tree->boxes);
    }
    ckd_free(tree->bbi);
    ckd_free(tree->lower);
    ckd_free(tree->upper);
    ckd_free(tree);
    return;
  }
  return;
}

Assistant:

void
free_kd_tree(kd_tree_node_t *tree)
{
	if (tree == NULL)
		return;
	free_kd_tree(tree->left);
	free_kd_tree(tree->right);
	if (tree->n_level)
		ckd_free_2d(tree->boxes);
	ckd_free(tree->bbi);
	ckd_free(tree->lower);
	ckd_free(tree->upper);
	ckd_free(tree);
}